

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O3

void deqp::gles2::Functional::checkError(TestContext *testCtx,Context *ctx,GLenum expect)

{
  ostringstream *this;
  GLenum GVar1;
  char *pcVar2;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  GVar1 = (*ctx->_vptr_Context[0x79])(ctx);
  local_1a0._0_8_ = testCtx->m_log;
  this = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ",3);
  pcVar2 = "Fail";
  if (GVar1 == expect) {
    pcVar2 = "Pass";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar2,4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", expected ",0xb);
  local_1b0.m_getName = glu::getErrorName;
  local_1b0.m_value = expect;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  if (GVar1 != expect) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Error code mismatch");
  }
  return;
}

Assistant:

static void checkError (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum expect)
{
	GLenum result = ctx.getError();
	testCtx.getLog() << TestLog::Message << "// " << (result == expect ? "Pass" : "Fail") << ", expected " << glu::getErrorStr(expect) << TestLog::EndMessage;

	if (result != expect)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error code mismatch");
}